

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execMove6<(moira::Instr)71,(moira::Mode)11,(moira::Size)2>(Moira *this,u16 opcode)

{
  ushort uVar1;
  u32 uVar2;
  undefined8 in_RAX;
  bool bVar3;
  bool error;
  bool local_31;
  
  local_31 = SUB81((ulong)in_RAX >> 0x38,0);
  uVar1 = (this->queue).irc;
  readExt(this);
  bVar3 = SUB21(uVar1 >> 0xf,0);
  (this->reg).sr.n = bVar3;
  (this->reg).sr.z = uVar1 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  uVar2 = computeEA<(moira::Mode)6,(moira::Size)2,0ul>(this,opcode >> 9 & 7);
  writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,uVar2,(uint)uVar1,&local_31);
  if (local_31 == false) {
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    (this->reg).sr.n = bVar3;
    (this->reg).sr.z = uVar1 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
  }
  return;
}

Assistant:

void
Moira::execMove6(u16 opcode)
{
    u32 ea, data;
    
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);
    
    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;
    
    if (S == Long && (M == MODE_DN || M == MODE_AN || M == MODE_IM)) {
        reg.sr.n = NBIT<Word>(data >> 16);
        reg.sr.z = ZERO<Word>(data >> 16) && reg.sr.z;
    } else {
        reg.sr.n = NBIT<S>(data);
        reg.sr.z = ZERO<S>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }
    
    if (!writeOp <MODE_IX,S> (dst, data)) return;
    prefetch<POLLIPL>();

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
}